

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O0

pointer_type
cppcms::impl::
mfunc_to_event_handler<cppcms::impl::cgi::http_watchdog,std::shared_ptr<cppcms::impl::cgi::http_watchdog>>
          (offset_in_http_watchdog_to_subr f,shared_ptr<cppcms::impl::cgi::http_watchdog> *s)

{
  event_handler_binder_p0<void_(cppcms::impl::cgi::http_watchdog::*)(const_std::error_code_&),_std::shared_ptr<cppcms::impl::cgi::http_watchdog>_>
  *in_RCX;
  shared_ptr<cppcms::impl::cgi::http_watchdog> *in_RDI;
  shared_ptr<cppcms::impl::cgi::http_watchdog> *p;
  
  p = in_RDI;
  operator_new(0x30);
  event_handler_binder_p0<void_(cppcms::impl::cgi::http_watchdog::*)(const_std::error_code_&),_std::shared_ptr<cppcms::impl::cgi::http_watchdog>_>
  ::event_handler_binder_p0(in_RCX,(offset_in_http_watchdog_to_subr *)p,in_RDI);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
            ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)in_RCX,
             (callable<void_(const_std::error_code_&)> *)p,SUB81((ulong)in_RDI >> 0x38,0));
  return (pointer_type)(callable<void_(const_std::error_code_&)> *)p;
}

Assistant:

booster::aio::event_handler::pointer_type mfunc_to_event_handler(void (C::*f)(booster::system::error_code const &e),S s)
{
	return new event_handler_binder_p0<void (C::*)(booster::system::error_code const &),S>(f,s);
}